

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O3

int deqp::gls::generateRandomAttribData
              (vector<unsigned_char,_std::allocator<unsigned_char>_> *attrDataBuf,
              int *dataSizeBytesDst,VarSpec *attrSpec,int numVertices,Random *rnd)

{
  float fVar1;
  float fVar2;
  DataType dataType;
  int iVar3;
  int iVar4;
  pointer puVar5;
  uint uVar6;
  int iVar7;
  deUint32 dVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  float fVar13;
  float *data;
  long local_60;
  
  dataType = attrSpec->type;
  uVar6 = glu::getDataTypeScalarSize(dataType);
  iVar11 = *(int *)&(attrDataBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                    ._M_impl.super__Vector_impl_data._M_finish -
           *(int *)&(attrDataBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                    ._M_impl.super__Vector_impl_data._M_start;
  if (iVar11 == 0) {
    iVar11 = 0;
  }
  else {
    uVar12 = iVar11 + 2;
    if (-1 < (int)(iVar11 - 1U)) {
      uVar12 = iVar11 - 1U;
    }
    iVar11 = (uVar12 & 0xfffffffc) + 4;
  }
  *dataSizeBytesDst = uVar6 * numVertices * 4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (attrDataBuf,(long)(int)(iVar11 + uVar6 * numVertices * 4));
  puVar5 = (attrDataBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (dataType - TYPE_FLOAT < 4) {
    if (0 < numVertices) {
      lVar10 = 0;
      iVar7 = 0;
      do {
        if (0 < (int)uVar6) {
          uVar9 = 0;
          do {
            fVar1 = *(float *)((long)&attrSpec->minValue + uVar9 * 4);
            fVar2 = *(float *)((long)&attrSpec->maxValue + uVar9 * 4);
            fVar13 = deRandom_getFloat(&rnd->m_rnd);
            *(float *)(puVar5 + (long)((int)lVar10 + (int)uVar9) * 4 + (long)iVar11) =
                 fVar13 * (fVar2 - fVar1) + fVar1;
            uVar9 = uVar9 + 1;
          } while (uVar6 != uVar9);
        }
        iVar7 = iVar7 + 1;
        lVar10 = lVar10 + (ulong)uVar6;
      } while (iVar7 != numVertices);
    }
  }
  else if (0 < numVertices) {
    local_60 = 0;
    iVar7 = 0;
    do {
      if (0 < (int)uVar6) {
        uVar9 = 0;
        do {
          iVar3 = *(int *)((long)&attrSpec->minValue + uVar9 * 4);
          iVar4 = *(int *)((long)&attrSpec->maxValue + uVar9 * 4);
          dVar8 = deRandom_getUint32(&rnd->m_rnd);
          if (iVar4 != 0x7fffffff || iVar3 != -0x80000000) {
            dVar8 = dVar8 % ((iVar4 - iVar3) + 1U) + iVar3;
          }
          *(deUint32 *)(puVar5 + (long)((int)local_60 + (int)uVar9) * 4 + (long)iVar11) = dVar8;
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
      iVar7 = iVar7 + 1;
      local_60 = local_60 + (ulong)uVar6;
    } while (iVar7 != numVertices);
  }
  return iVar11;
}

Assistant:

static int generateRandomAttribData (vector<deUint8>& attrDataBuf, int& dataSizeBytesDst, const VarSpec& attrSpec, const int numVertices, Random& rnd)
{
	const bool	isFloat			= glu::isDataTypeFloatOrVec(attrSpec.type);
	const int	numComponents	= glu::getDataTypeScalarSize(attrSpec.type);
	const int	componentSize	= (int)(isFloat ? sizeof(GLfloat) : sizeof(GLint));
	const int	offsetInBuf		= nextDivisible((int)attrDataBuf.size(), componentSize); // Round up for alignment.

	DE_STATIC_ASSERT(sizeof(GLint) == sizeof(int));
	DE_STATIC_ASSERT(sizeof(GLfloat) == sizeof(float));

	dataSizeBytesDst = numComponents*componentSize*numVertices;

	attrDataBuf.resize(offsetInBuf + dataSizeBytesDst);

	if (isFloat)
	{
		float* const data = (float*)&attrDataBuf[offsetInBuf];

		for (int vtxNdx = 0; vtxNdx < numVertices; vtxNdx++)
			for (int compNdx = 0; compNdx < numComponents; compNdx++)
				data[vtxNdx*numComponents + compNdx] = rnd.getFloat(attrSpec.minValue.f[compNdx], attrSpec.maxValue.f[compNdx]);
	}
	else
	{
		DE_ASSERT(glu::isDataTypeIntOrIVec(attrSpec.type));

		int* const data = (int*)&attrDataBuf[offsetInBuf];

		for (int vtxNdx = 0; vtxNdx < numVertices; vtxNdx++)
			for (int compNdx = 0; compNdx < numComponents; compNdx++)
				data[vtxNdx*numComponents + compNdx] = rnd.getInt(attrSpec.minValue.i[compNdx], attrSpec.maxValue.i[compNdx]);
	}

	return offsetInBuf;
}